

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

void __thiscall QTextEdit::setText(QTextEdit *this,QString *text)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  QAnyStringView QVar4;
  
  QVar4.m_size = (text->d).size | 0x8000000000000000;
  QVar4.field_0.m_data_utf16 = (text->d).ptr;
  cVar2 = Qt::mightBeRichText(QVar4);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if (cVar2 == '\0') {
    QWidgetTextControl::setPlainText(*(QWidgetTextControl **)(lVar1 + 0x2f8),text);
    bVar3 = *(byte *)(lVar1 + 800) & 0xfd;
  }
  else {
    QWidgetTextControl::setHtml(*(QWidgetTextControl **)(lVar1 + 0x2f8),text);
    bVar3 = *(byte *)(lVar1 + 800) | 2;
  }
  *(byte *)(lVar1 + 800) = bVar3;
  return;
}

Assistant:

void QTextEdit::setText(const QString &text)
{
    Qt::TextFormat format = Qt::mightBeRichText(text) ? Qt::RichText : Qt::PlainText;
#ifndef QT_NO_TEXTHTMLPARSER
    if (format == Qt::RichText)
        setHtml(text);
    else
#else
    Q_UNUSED(format);
#endif
        setPlainText(text);
}